

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CheckLOF(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  AActor *origin;
  VMValue *pVVar1;
  AActor *other;
  sector_t_conflict *sector;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_300;
  int local_2c4;
  bool local_2b3;
  int u_4;
  int u_3;
  int u_2;
  LOFData lof_data;
  FTraceResults trace;
  sector_t_conflict *sec;
  double local_188;
  double cp;
  undefined1 auStack_178 [4];
  int u_1;
  DVector2 xy_1;
  double c_1;
  double s_1;
  TAngle<double> local_150;
  TAngle<double> local_148;
  TAngle<double> local_140;
  TAngle<double> local_138;
  double local_130;
  double xydist;
  DVector2 xy;
  double c;
  double s;
  undefined1 local_100 [20];
  int u;
  double distance;
  TAngle<double> local_d0;
  DAngle ang;
  double offsetforward;
  Angle AStack_b8;
  int ptr_target;
  double offsetwidth;
  double offsetheight;
  DAngle pitch;
  DAngle angle;
  double minrange;
  double range;
  int flags;
  AActor *self;
  undefined1 local_70 [4];
  int paramnum;
  DVector3 vel;
  DVector3 pos;
  AActor *target;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  TVector3<double>::TVector3((TVector3<double> *)&vel.Z);
  TVector3<double>::TVector3((TVector3<double> *)local_70);
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xfd6,
                  "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xfd6,
                  "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  origin = *(AActor **)&param->field_0;
  local_2b3 = true;
  if (origin != (AActor *)0x0) {
    local_2b3 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
  }
  if (local_2b3 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xfd6,
                  "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd7,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    range._4_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd7,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    range._4_4_ = param[1].field_0.i;
  }
  if (numparam < 3) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd8,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    minrange = (pVVar1->field_0).f;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd8,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    minrange = param[2].field_0.f;
  }
  if (numparam < 4) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd9,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    angle.Degrees = (double)(pVVar1->field_0).field_1.a;
  }
  else {
    if (param[3].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd9,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    angle.Degrees = (double)param[3].field_0.field_1.a;
  }
  TAngle<double>::TAngle(&pitch);
  if (numparam < 5) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfda,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    TAngle<double>::operator=(&pitch,(pVVar1->field_0).f);
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfda,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    TAngle<double>::operator=(&pitch,param[4].field_0.f);
  }
  TAngle<double>::TAngle((TAngle<double> *)&offsetheight);
  if (numparam < 6) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdb,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    TAngle<double>::operator=((TAngle<double> *)&offsetheight,(pVVar1->field_0).f);
  }
  else {
    if (param[5].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdb,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    TAngle<double>::operator=((TAngle<double> *)&offsetheight,param[5].field_0.f);
  }
  if (numparam < 7) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdc,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    offsetwidth = (pVVar1->field_0).f;
  }
  else {
    if (param[6].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdc,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    offsetwidth = param[6].field_0.f;
  }
  if (numparam < 8) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdd,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    AStack_b8.Degrees = (pVVar1->field_0).f;
  }
  else {
    if (param[7].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdd,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    AStack_b8.Degrees = param[7].field_0.f;
  }
  if (numparam < 9) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfde,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
    offsetforward._4_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[8].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfde,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    offsetforward._4_4_ = param[8].field_0.i;
  }
  if (numparam < 10) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdf,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
    ang.Degrees = (double)(pVVar1->field_0).field_1.a;
  }
  else {
    if (param[9].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdf,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    ang.Degrees = (double)param[9].field_0.field_1.a;
  }
  TAngle<double>::TAngle(&local_d0);
  if (offsetforward._4_4_ == 0) {
    local_2c4 = 0x13;
  }
  else {
    local_2c4 = offsetforward._4_4_;
  }
  other = COPY_AAPTR(origin,local_2c4);
  if ((range._4_4_ & 0x80000) != 0) {
    if (origin->player == (player_t *)0x0) {
      dVar3 = origin->Height;
    }
    else {
      dVar3 = (origin->player->mo->super_AActor).Height * origin->player->crouchfactor;
    }
    offsetwidth = dVar3 * offsetwidth;
  }
  if ((range._4_4_ & 0x100000) != 0) {
    ang.Degrees = origin->radius * ang.Degrees;
    AStack_b8.Degrees = origin->radius * AStack_b8.Degrees;
  }
  AActor::PosPlusZ((DVector3 *)&distance,origin,offsetwidth - origin->Floorclip);
  TVector3<double>::operator=((TVector3<double> *)&vel.Z,(TVector3<double> *)&distance);
  if ((range._4_4_ & 0x40000) == 0) {
    dVar3 = origin->Height * 0.5 + pos.Y;
    if (origin->player == (player_t *)0x0) {
      pos.Y = dVar3 + 8.0;
    }
    else {
      pos.Y = origin->player->mo->AttackZOffset * origin->player->crouchfactor + dVar3;
    }
  }
  if (other == (AActor *)0x0) {
    if ((range._4_4_ & 0x1000) == 0) {
      cp._4_4_ = 0;
      if (numret < 1) {
        return 0;
      }
      if (ret != (VMReturn *)0x0) {
        VMReturn::SetInt(ret,0);
        return 1;
      }
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1040,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    TAngle<double>::TAngle(&local_150,&(origin->Angles).Yaw);
    TAngle<double>::operator+=(&pitch,&local_150);
    TAngle<double>::TAngle((TAngle<double> *)&s_1,&(origin->Angles).Pitch);
    TAngle<double>::operator+=((TAngle<double> *)&offsetheight,(TAngle<double> *)&s_1);
    dVar3 = TAngle<double>::Sin(&pitch);
    xy_1.Y = TAngle<double>::Cos(&pitch);
    AActor::Vec2Offset((AActor *)auStack_178,ang.Degrees * xy_1.Y + AStack_b8.Degrees * dVar3,
                       ang.Degrees * dVar3 - AStack_b8.Degrees * xy_1.Y,SUB81(origin,0));
    vel.Z = (double)_auStack_178;
  }
  else {
    if (((0.0 < minrange) && ((range._4_4_ & 0x2000) == 0)) &&
       (register0x00001200 = AActor::Distance3D(origin,other,false), minrange < register0x00001200))
    {
      local_100._12_4_ = 0;
      if (numret < 1) {
        return 0;
      }
      if (ret != (VMReturn *)0x0) {
        VMReturn::SetInt(ret,0);
        return 1;
      }
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x100f,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if ((range._4_4_ & 2) == 0) {
      AActor::AngleTo((AActor *)local_100,origin,SUB81(other,0));
      TAngle<double>::operator=(&local_d0,(TAngle<double> *)local_100);
    }
    else {
      TAngle<double>::operator=(&local_d0,&(origin->Angles).Yaw);
    }
    TAngle<double>::TAngle((TAngle<double> *)&s,&local_d0);
    TAngle<double>::operator+=(&pitch,(TAngle<double> *)&s);
    dVar3 = TAngle<double>::Sin(&local_d0);
    xy.Y = TAngle<double>::Cos(&local_d0);
    AActor::Vec2Offset((AActor *)&xydist,ang.Degrees * xy.Y + AStack_b8.Degrees * dVar3,
                       ang.Degrees * dVar3 - AStack_b8.Degrees * xy.Y,SUB81(origin,0));
    vel.Z = xydist;
    dVar3 = AActor::Distance2D(origin,other,false);
    local_130 = dVar3;
    if ((range._4_4_ & 1) == 0) {
      if ((range._4_4_ & 0x400000) == 0) {
        dVar4 = AActor::Center(other);
        VecToAngle(dVar3,dVar4 - pos.Y);
        TAngle<double>::operator-=((TAngle<double> *)&offsetheight,&local_148);
      }
      else {
        dVar4 = AActor::Center(other);
        VecToAngle(dVar3,(dVar4 - pos.Y) + offsetwidth);
        TAngle<double>::operator-=((TAngle<double> *)&offsetheight,&local_140);
      }
    }
    else {
      TAngle<double>::TAngle(&local_138,&(origin->Angles).Pitch);
      TAngle<double>::operator+=((TAngle<double> *)&offsetheight,&local_138);
    }
  }
  dVar4 = TAngle<double>::Cos((TAngle<double> *)&offsetheight);
  local_188 = dVar4;
  dVar5 = TAngle<double>::Cos(&pitch);
  dVar3 = local_188;
  dVar6 = TAngle<double>::Sin(&pitch);
  dVar7 = TAngle<double>::Sin((TAngle<double> *)&offsetheight);
  TVector3<double>::TVector3((TVector3<double> *)&sec,dVar4 * dVar5,dVar3 * dVar6,-dVar7);
  TVector3<double>::operator=((TVector3<double> *)local_70,(TVector3<double> *)&sec);
  TVector2<double>::TVector2
            ((TVector2<double> *)&trace.Crossed3DWaterPos.Z,(TVector3<double> *)&vel.Z);
  sector = (sector_t_conflict *)P_PointInSector((DVector2 *)&trace.Crossed3DWaterPos.Z);
  if ((minrange == 0.0) && (!NAN(minrange))) {
    local_300 = 8192.0;
    if (origin->player == (player_t *)0x0) {
      local_300 = 2048.0;
    }
    minrange = local_300;
  }
  FTraceResults::FTraceResults((FTraceResults *)&lof_data.Flags);
  lof_data.Target._0_4_ = range._4_4_;
  lof_data.Target._4_1_ = 0;
  _u_2 = origin;
  lof_data.Self = other;
  TFlags<ActorFlag,_unsigned_int>::FromInt((TFlags<ActorFlag,_unsigned_int> *)&u_3,0xffffffff);
  Trace((DVector3 *)&vel.Z,sector,(DVector3 *)local_70,minrange,(ActorFlags *)&u_3,0x8000,origin,
        (FTraceResults *)&lof_data.Flags,8,CheckLOFTraceFunc,&u_2);
  if ((trace.Line._4_4_ == 4) ||
     ((((range._4_4_ & 0x200000) != 0 && ((lof_data.Target._4_1_ & 1) == 0)) &&
      (trace.Line._4_4_ != 0)))) {
    if ((angle.Degrees <= 0.0) || (angle.Degrees <= trace.SrcAngleFromTarget.Degrees)) {
      if ((trace.Line._4_4_ == 4) && ((trace.Fraction != 0.0 && ((lof_data.Target._4_1_ & 1) == 0)))
         ) {
        if ((range._4_4_ & 0x800000) != 0) {
          TObjPtr<AActor>::operator=(&origin->target,(AActor *)trace.Fraction);
        }
        if ((range._4_4_ & 0x1000000) != 0) {
          TObjPtr<AActor>::operator=(&origin->master,(AActor *)trace.Fraction);
        }
        if ((range._4_4_ & 0x2000000) != 0) {
          TObjPtr<AActor>::operator=(&origin->tracer,(AActor *)trace.Fraction);
        }
      }
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x106e,
                        "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,1);
        param_local._4_4_ = 1;
      }
    }
    else if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1066,
                      "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      VMReturn::SetInt(ret,0);
      param_local._4_4_ = 1;
    }
  }
  else if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1070,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,0);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckLOF)
{
	// Check line of fire

	/*
		Not accounted for / I don't know how it works: FLOORCLIP
	*/

	AActor *target;
	DVector3 pos;
	DVector3 vel;

	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)			
	PARAM_FLOAT_DEF	(range)			
	PARAM_FLOAT_DEF	(minrange)		
	PARAM_ANGLE_DEF	(angle)			
	PARAM_ANGLE_DEF	(pitch)			
	PARAM_FLOAT_DEF	(offsetheight)	
	PARAM_FLOAT_DEF	(offsetwidth)	
	PARAM_INT_DEF	(ptr_target)	
	PARAM_FLOAT_DEF	(offsetforward)	

	DAngle ang;

	target = COPY_AAPTR(self, ptr_target == AAPTR_DEFAULT ? AAPTR_TARGET|AAPTR_PLAYER_GETTARGET|AAPTR_NULL : ptr_target); // no player-support by default

	if (flags & CLOFF_MUL_HEIGHT)
	{
		if (self->player != NULL)
		{
			// Synced with hitscan: self->player->mo->height is strangely conscientious about getting the right actor for player
			offsetheight *= self->player->mo->Height * self->player->crouchfactor;
		}
		else
		{
			offsetheight *= self->Height;
		}
	}
	if (flags & CLOFF_MUL_WIDTH)
	{
		offsetforward *= self->radius;
		offsetwidth *= self->radius;
}
		
	pos = self->PosPlusZ(offsetheight - self->Floorclip);

		if (!(flags & CLOFF_FROMBASE))
		{ // default to hitscan origin

			// Synced with hitscan: self->Height is strangely NON-conscientious about getting the right actor for player
			pos.Z += self->Height *0.5;
			if (self->player != NULL)
			{
				pos.Z += self->player->mo->AttackZOffset * self->player->crouchfactor;
			}
			else
			{
				pos.Z += 8;
			}
		}

		if (target)
		{
			if (range > 0 && !(flags & CLOFF_CHECKPARTIAL))
			{
				double distance = self->Distance3D(target);
				if (distance > range)
				{
					ACTION_RETURN_BOOL(false);
				}
			}

			if (flags & CLOFF_NOAIM_HORZ)
			{
				ang = self->Angles.Yaw;
			}
			else ang = self->AngleTo (target);
				
			angle += ang;

			double s = ang.Sin();
			double c = ang.Cos();
				
			DVector2 xy = self->Vec2Offset(offsetforward * c + offsetwidth * s, offsetforward * s - offsetwidth * c);

			pos.X = xy.X;
			pos.Y = xy.Y;

			double xydist = self->Distance2D(target);
			if (flags & CLOFF_NOAIM_VERT)
			{
				pitch += self->Angles.Pitch;
			}
			else if (flags & CLOFF_AIM_VERT_NOOFFSET)
			{
				pitch -= VecToAngle(xydist, target->Center() - pos.Z + offsetheight);
			}
			else
			{
				pitch -= VecToAngle(xydist, target->Center() - pos.Z);
			}
		}
		else if (flags & CLOFF_ALLOWNULL)
		{
			angle += self->Angles.Yaw;
			pitch += self->Angles.Pitch;

			double s = angle.Sin();
			double c = angle.Cos();

			DVector2 xy = self->Vec2Offset(offsetforward * c + offsetwidth * s, offsetforward * s - offsetwidth * c);

			pos.X = xy.X;
			pos.Y = xy.Y;
		}
		else
		{
			ACTION_RETURN_BOOL(false);
		}

		double cp = pitch.Cos();

		vel = { cp * angle.Cos(), cp * angle.Sin(), -pitch.Sin() };

	/* Variable set:

		jump, flags, target
		pos (trace point of origin)
		vel (trace unit vector)
		range
	*/

	sector_t *sec = P_PointInSector(pos);

	if (range == 0)
	{
		range = (self->player != NULL) ? PLAYERMISSILERANGE : MISSILERANGE;
	}

	FTraceResults trace;
	LOFData lof_data;

	lof_data.Self = self;
	lof_data.Target = target;
	lof_data.Flags = flags;
	lof_data.BadActor = false;

	Trace(pos, sec, vel, range, ActorFlags::FromInt(0xFFFFFFFF), ML_BLOCKEVERYTHING, self, trace, TRACE_PortalRestrict,
		CheckLOFTraceFunc, &lof_data);

	if (trace.HitType == TRACE_HitActor ||
		((flags & CLOFF_JUMP_ON_MISS) && !lof_data.BadActor && trace.HitType != TRACE_HitNone))
	{
		if (minrange > 0 && trace.Distance < minrange)
		{
			ACTION_RETURN_BOOL(false);
		}
		if ((trace.HitType == TRACE_HitActor) && (trace.Actor != NULL) && !(lof_data.BadActor))
		{
			if (flags & (CLOFF_SETTARGET))	self->target = trace.Actor;
			if (flags & (CLOFF_SETMASTER))	self->master = trace.Actor;
			if (flags & (CLOFF_SETTRACER))	self->tracer = trace.Actor;
		}
		ACTION_RETURN_BOOL(true);
	}
	ACTION_RETURN_BOOL(false);
}